

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawStringPropDecal
          (PixelGameEngine *this,vf2d *pos,string *sText,Pixel col,vf2d *scale)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pvVar4;
  ushort uVar5;
  ushort uVar6;
  size_type sVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  anon_union_4_2_12391da5_for_Pixel_0 local_54;
  vf2d local_50;
  vf2d local_48;
  vf2d local_40;
  vf2d *local_38;
  
  sVar2 = sText->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (sText->_M_dataplus)._M_p;
    fVar10 = 0.0;
    sVar7 = 0;
    fVar9 = 0.0;
    local_54 = col.field_0;
    local_38 = pos;
    do {
      cVar1 = pcVar3[sVar7];
      lVar8 = (long)cVar1;
      if (lVar8 == 10) {
        fVar10 = fVar10 + scale->y * 8.0;
        fVar9 = 0.0;
      }
      else {
        uVar5 = (short)cVar1 - 0x20;
        uVar6 = (short)cVar1 - 0x11;
        if (-1 < (short)uVar5) {
          uVar6 = uVar5;
        }
        local_40.x = local_38->x + fVar9;
        local_40.y = local_38->y + fVar10;
        pvVar4 = (this->vFontSpacing).
                 super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_48.x = (float)(int)(short)(uVar5 - (uVar6 & 0xfff0)) * 8.0 +
                     (float)pvVar4[lVar8 + -0x20].x;
        local_48.y = (float)((int)(short)uVar6 >> 4) * 8.0;
        local_50.x = (float)pvVar4[lVar8 + -0x20].y;
        local_50.y = 8.0;
        DrawPartialDecal(this,&local_40,this->fontDecal,&local_48,&local_50,scale,
                         (Pixel *)&local_54.field_1);
        fVar9 = fVar9 + (float)(this->vFontSpacing).
                               super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar8 + -0x20].y * scale->x
        ;
      }
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawStringPropDecal(const olc::vf2d& pos, const std::string& sText, const Pixel col, const olc::vf2d& scale)
	{
		olc::vf2d spos = { 0.0f, 0.0f };
		for (auto c : sText)
		{
			if (c == '\n')
			{
				spos.x = 0; spos.y += 8.0f * scale.y;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;
				DrawPartialDecal(pos + spos, fontDecal, { float(ox) * 8.0f + float(vFontSpacing[c - 32].x), float(oy) * 8.0f }, { float(vFontSpacing[c - 32].y), 8.0f }, scale, col);
				spos.x += float(vFontSpacing[c - 32].y) * scale.x;
			}
		}
	}